

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

uint pcmpxstrx(CPUX86State *env,ZMMReg *d,ZMMReg *s,int8_t ctrl,int valids,int validd)

{
  sbyte sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  int i;
  uint uVar14;
  
  iVar9 = (uint)((ctrl & 1U) == 0) * 8 + 7;
  i = valids + -1;
  iVar2 = validd + -1;
  uVar7 = (ulong)((uint)(validd <= iVar9) << 7 | (uint)(valids <= iVar9) << 6);
  env->cc_src = uVar7;
  uVar13 = (byte)ctrl >> 2 & 3;
  sVar1 = (sbyte)iVar9;
  switch(uVar13) {
  case 0:
    for (; -1 < i; i = i + -1) {
      uVar13 = uVar13 * 2;
      iVar10 = pcmp_val(s,ctrl,i);
      iVar9 = iVar2;
      while( true ) {
        if (iVar9 < 0) break;
        iVar12 = pcmp_val(d,ctrl,iVar9);
        uVar13 = uVar13 | iVar10 == iVar12;
        iVar9 = iVar9 + -1;
      }
    }
    break;
  case 1:
    uVar13 = 0;
    for (; -1 < i; i = i + -1) {
      uVar13 = uVar13 * 2;
      iVar2 = pcmp_val(s,ctrl,i);
      uVar14 = validd | 1;
      while( true ) {
        if ((int)uVar14 < 2) break;
        iVar9 = pcmp_val(d,ctrl,uVar14 - 2);
        uVar6 = 0;
        if (iVar2 <= iVar9) {
          iVar9 = pcmp_val(d,ctrl,uVar14 - 3);
          uVar6 = (uint)(iVar9 <= iVar2);
        }
        uVar13 = uVar13 | uVar6;
        uVar14 = uVar14 - 2;
      }
    }
    break;
  case 2:
    iVar9 = iVar2;
    if (iVar2 < i) {
      iVar9 = i;
    }
    iVar10 = iVar2;
    if (i < iVar2) {
      iVar10 = i;
    }
    lVar5 = (long)i - (long)iVar2;
    lVar8 = -lVar5;
    if (0 < lVar5) {
      lVar8 = lVar5;
    }
    uVar13 = ~(-1 << (sVar1 - (char)iVar9 & 0x1fU)) << ((byte)lVar8 & 0x1f);
    for (; -1 < iVar10; iVar10 = iVar10 + -1) {
      iVar2 = pcmp_val(s,ctrl,iVar10);
      iVar9 = pcmp_val(d,ctrl,iVar10);
      uVar13 = (uint)(iVar2 == iVar9) + uVar13 * 2;
    }
    break;
  case 3:
    if (validd == 0) {
      uVar13 = (2 << sVar1) - 1;
    }
    else {
      uVar13 = 0;
      for (iVar9 = valids - validd; -1 < iVar9; iVar9 = iVar9 + -1) {
        uVar14 = 1;
        iVar10 = i;
        for (iVar12 = iVar2; -1 < iVar12; iVar12 = iVar12 + -1) {
          iVar3 = pcmp_val(s,ctrl,iVar10);
          iVar4 = pcmp_val(d,ctrl,iVar12);
          if (iVar3 != iVar4) {
            uVar14 = 0;
          }
          iVar10 = iVar10 + -1;
        }
        uVar13 = uVar13 * 2 | uVar14;
        i = i + -1;
      }
    }
  }
  bVar11 = (byte)ctrl >> 4 & 3;
  if (bVar11 == 3) {
    uVar13 = ~(-1 << ((byte)valids & 0x1f) ^ uVar13);
  }
  else if (bVar11 == 1) {
    uVar13 = uVar13 ^ (2 << sVar1) - 1U;
  }
  if ((uVar13 != 0) && (env->cc_src = uVar7 | 1, (uVar13 & 1) != 0)) {
    env->cc_src = uVar7 | 0x801;
  }
  return uVar13;
}

Assistant:

static inline unsigned pcmpxstrx(CPUX86State *env, Reg *d, Reg *s,
                                 int8_t ctrl, int valids, int validd)
{
    unsigned int res = 0;
    int v;
    int j, i;
    int upper = (ctrl & 1) ? 7 : 15;

    valids--;
    validd--;

    CC_SRC = (valids < upper ? CC_Z : 0) | (validd < upper ? CC_S : 0);

    switch ((ctrl >> 2) & 3) {
    case 0:
        for (j = valids; j >= 0; j--) {
            res <<= 1;
            v = pcmp_val(s, ctrl, j);
            for (i = validd; i >= 0; i--) {
                res |= (v == pcmp_val(d, ctrl, i));
            }
        }
        break;
    case 1:
        for (j = valids; j >= 0; j--) {
            res <<= 1;
            v = pcmp_val(s, ctrl, j);
            for (i = ((validd - 1) | 1); i >= 0; i -= 2) {
                res |= (pcmp_val(d, ctrl, i - 0) >= v &&
                        pcmp_val(d, ctrl, i - 1) <= v);
            }
        }
        break;
    case 2:
        res = (1 << (upper - MAX(valids, validd))) - 1;
        res <<= MAX(valids, validd) - MIN(valids, validd);
        for (i = MIN(valids, validd); i >= 0; i--) {
            res <<= 1;
            v = pcmp_val(s, ctrl, i);
            res |= (v == pcmp_val(d, ctrl, i));
        }
        break;
    case 3:
        if (validd == -1) {
            res = (2 << upper) - 1;
            break;
        }
        for (j = valids - validd; j >= 0; j--) {
            res <<= 1;
            v = 1;
            for (i = validd; i >= 0; i--) {
                v &= (pcmp_val(s, ctrl, i + j) == pcmp_val(d, ctrl, i));
            }
            res |= v;
        }
        break;
    }

    switch ((ctrl >> 4) & 3) {
    case 1:
        res ^= (2 << upper) - 1;
        break;
    case 3:
        res ^= (1 << (valids + 1)) - 1;
        break;
    }

    if (res) {
        CC_SRC |= CC_C;
    }
    if (res & 1) {
        CC_SRC |= CC_O;
    }

    return res;
}